

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primality-test-baseline.c
# Opt level: O1

int gaICtz(uint64_t n)

{
  long lVar1;
  
  if (n != 0) {
    lVar1 = 0;
    if (n != 0) {
      for (; (n >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    return (int)lVar1;
  }
  return 0x40;
}

Assistant:

int      gaICtz       (uint64_t n){
#if __GNUC__ >= 4
	return n ? __builtin_ctzll(n) : 64;
#else
	int z;

	for(z=0;z<64;z++){
		if((n>>z) & 1){break;}
	}

	return z;
#endif
}